

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

string * cmState::GetTargetTypeName_abi_cxx11_(TargetType targetType)

{
  int iVar1;
  
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSTATIC_LIBRARY_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propSTATIC_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSTATIC_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propSTATIC_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSTATIC_LIBRARY_abi_cxx11_,"STATIC_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propSTATIC_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propSTATIC_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propMODULE_LIBRARY_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propMODULE_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propMODULE_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propMODULE_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propMODULE_LIBRARY_abi_cxx11_,"MODULE_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propMODULE_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propMODULE_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSHARED_LIBRARY_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propSHARED_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propSHARED_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propSHARED_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propSHARED_LIBRARY_abi_cxx11_,"SHARED_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propSHARED_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propSHARED_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propOBJECT_LIBRARY_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propOBJECT_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propOBJECT_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propOBJECT_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propOBJECT_LIBRARY_abi_cxx11_,"OBJECT_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propOBJECT_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propOBJECT_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propEXECUTABLE_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_._M_dataplus.
      _M_p = (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                       propEXECUTABLE_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEXECUTABLE_abi_cxx11_,
                 "EXECUTABLE","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propEXECUTABLE_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propEXECUTABLE_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propUTILITY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_._M_dataplus.
      _M_p = (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                       propUTILITY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_,
                 "UTILITY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUTILITY_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propUTILITY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propGLOBAL_TARGET_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propGLOBAL_TARGET_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propGLOBAL_TARGET_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propGLOBAL_TARGET_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propGLOBAL_TARGET_abi_cxx11_,"GLOBAL_TARGET","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propGLOBAL_TARGET_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propGLOBAL_TARGET_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propINTERFACE_LIBRARY_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propINTERFACE_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propINTERFACE_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propINTERFACE_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propINTERFACE_LIBRARY_abi_cxx11_,"INTERFACE_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propINTERFACE_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propINTERFACE_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUNKNOWN_LIBRARY_abi_cxx11_ == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                                 propUNKNOWN_LIBRARY_abi_cxx11_);
    if (iVar1 != 0) {
      GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propUNKNOWN_LIBRARY_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                     propUNKNOWN_LIBRARY_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                  propUNKNOWN_LIBRARY_abi_cxx11_,"UNKNOWN_LIBRARY","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                    propUNKNOWN_LIBRARY_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::
                           propUNKNOWN_LIBRARY_abi_cxx11_);
    }
  }
  if (GetTargetTypeName[abi:cxx11](cmStateEnums::TargetType)::propEmpty_abi_cxx11_ == '\0') {
    GetTargetTypeName_abi_cxx11_();
  }
  if (targetType < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
    return (string *)(&PTR_propEXECUTABLE_abi_cxx11__008887d0)[targetType];
  }
  __assert_fail("false && \"Unexpected target type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x4b,
                "static const std::string &cmState::GetTargetTypeName(cmStateEnums::TargetType)");
}

Assistant:

const std::string& cmState::GetTargetTypeName(
  cmStateEnums::TargetType targetType)
{
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(STATIC_LIBRARY);
  MAKE_STATIC_PROP(MODULE_LIBRARY);
  MAKE_STATIC_PROP(SHARED_LIBRARY);
  MAKE_STATIC_PROP(OBJECT_LIBRARY);
  MAKE_STATIC_PROP(EXECUTABLE);
  MAKE_STATIC_PROP(UTILITY);
  MAKE_STATIC_PROP(GLOBAL_TARGET);
  MAKE_STATIC_PROP(INTERFACE_LIBRARY);
  MAKE_STATIC_PROP(UNKNOWN_LIBRARY);
  static const std::string propEmpty;
#undef MAKE_STATIC_PROP

  switch (targetType) {
    case cmStateEnums::STATIC_LIBRARY:
      return propSTATIC_LIBRARY;
    case cmStateEnums::MODULE_LIBRARY:
      return propMODULE_LIBRARY;
    case cmStateEnums::SHARED_LIBRARY:
      return propSHARED_LIBRARY;
    case cmStateEnums::OBJECT_LIBRARY:
      return propOBJECT_LIBRARY;
    case cmStateEnums::EXECUTABLE:
      return propEXECUTABLE;
    case cmStateEnums::UTILITY:
      return propUTILITY;
    case cmStateEnums::GLOBAL_TARGET:
      return propGLOBAL_TARGET;
    case cmStateEnums::INTERFACE_LIBRARY:
      return propINTERFACE_LIBRARY;
    case cmStateEnums::UNKNOWN_LIBRARY:
      return propUNKNOWN_LIBRARY;
  }
  assert(false && "Unexpected target type");
  return propEmpty;
}